

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_node_grp * lysp_node_groupings(lysp_node *node)

{
  ushort uVar1;
  lysp_node_grp *plVar2;
  long lVar3;
  
  uVar1 = node->nodetype;
  plVar2 = (lysp_node_grp *)0x0;
  if (uVar1 < 0x400) {
    if (uVar1 < 0x100) {
      lVar3 = 0x60;
      if ((uVar1 != 1) && (uVar1 != 0x10)) {
        return plVar2;
      }
      goto LAB_001605ae;
    }
    if ((uVar1 != 0x100) && (uVar1 != 0x200)) {
      return plVar2;
    }
LAB_001605a2:
    lVar3 = 0x48;
  }
  else {
    if (uVar1 < 0x2000) {
      if ((uVar1 != 0x400) && (uVar1 != 0x1000)) {
        return plVar2;
      }
    }
    else if (uVar1 != 0x2000) {
      if (uVar1 != 0x4000) {
        return plVar2;
      }
      goto LAB_001605a2;
    }
    lVar3 = 0x50;
  }
LAB_001605ae:
  return *(lysp_node_grp **)((long)&node->parent + lVar3);
}

Assistant:

lysp_node_grp *
lysp_node_groupings(const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        return ((struct lysp_node_container *)node)->groupings;
    case LYS_LIST:
        return ((struct lysp_node_list *)node)->groupings;
    case LYS_GROUPING:
        return ((struct lysp_node_grp *)node)->groupings;
    case LYS_RPC:
    case LYS_ACTION:
        return ((struct lysp_node_action *)node)->groupings;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return ((struct lysp_node_action_inout *)node)->groupings;
    case LYS_NOTIF:
        return ((struct lysp_node_notif *)node)->groupings;
    default:
        return NULL;
    }
}